

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

void e2e_fdb_del_person(storage_t *st,person_t *p)

{
  bool bVar1;
  fdb_status fVar2;
  char *keylen;
  idx_prams_t *idxp;
  char *in_RSI;
  long in_RDI;
  byte bVar3;
  bool existed;
  bool indexed;
  fdb_doc *doc;
  fdb_status status;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  void *in_stack_ffffffffffffff60;
  person_t *p_00;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  fdb_doc **in_stack_ffffffffffffff78;
  char *key;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  fdb_doc *doc_00;
  fdb_doc *in_stack_ffffffffffffffb0;
  fdb_kvs_handle *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  storage_t *in_stack_ffffffffffffffe0;
  __suseconds_t local_18;
  tx_type_t tStack_12;
  
  gettimeofday((timeval *)&stack0xffffffffffffffe0,(__timezone_ptr_t)0x0);
  doc_00 = (fdb_doc *)0x0;
  key = in_RSI;
  strlen(in_RSI);
  fdb_doc_create(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60,0,(void *)0x10a11a,(size_t)doc_00);
  fVar2 = fdb_get(*(fdb_kvs_handle **)(in_RDI + 8),doc_00);
  bVar3 = fVar2 == FDB_RESULT_SUCCESS;
  fVar2 = fdb_del(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x104);
    e2e_fdb_del_person::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0x104,"void e2e_fdb_del_person(storage_t *, person_t *)");
    }
  }
  keylen = in_RSI + 0x400;
  strlen(in_RSI + 0x400);
  fVar2 = fdb_del_kv((fdb_kvs_handle *)
                     CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(bVar3,in_stack_ffffffffffffff88)),
                     key,(size_t)keylen);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x108);
    e2e_fdb_del_person::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0x108,"void e2e_fdb_del_person(storage_t *, person_t *)");
    }
  }
  p_00 = *(person_t **)(in_RDI + 0x18);
  idxp = (idx_prams_t *)(in_RSI + 0x400);
  strlen(in_RSI + 0x400);
  fVar2 = fdb_del_kv((fdb_kvs_handle *)
                     CONCAT17(in_stack_ffffffffffffff8f,CONCAT16(bVar3,in_stack_ffffffffffffff88)),
                     key,(size_t)keylen);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
            ,0x10c);
    e2e_fdb_del_person::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                    ,0x10c,"void e2e_fdb_del_person(storage_t *, person_t *)");
    }
  }
  save_tx(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,tStack_12);
  if ((bVar3 & 1) != 0) {
    bVar1 = is_indexed(idxp,p_00);
    if (bVar1) {
      *(int *)(*(long *)(in_RDI + 0x38) + 0x404) = *(int *)(*(long *)(in_RDI + 0x38) + 0x404) + -1;
      *(int *)(*(long *)(in_RDI + 0x38) + 0x408) =
           *(int *)(*(long *)(in_RDI + 0x38) + 0x408) - *(int *)(in_RSI + 0xe08);
    }
    *(int *)(*(long *)(in_RDI + 0x38) + 0x400) = *(int *)(*(long *)(in_RDI + 0x38) + 0x400) + -1;
  }
  fdb_doc_free((fdb_doc *)0x10a3d1);
  return;
}

Assistant:

void e2e_fdb_del_person(storage_t *st, person_t *p){
    TEST_INIT();

    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    fdb_doc_create(&doc, p->key, strlen(p->key), NULL, 0, NULL, 0);

    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_del(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_del_kv(st->index1, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_del_kv(st->index2, p->name, strlen(p->name));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, DEL_PERSON);

    if(existed){ // check if was indexed
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed--;
            st->v_chk->sum_age_indexed-=p->age;
        }
        st->v_chk->ndocs -= 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}